

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void Am_Animator_Start_Do_proc(Am_Object *interp)

{
  Am_Value *pAVar1;
  Am_Object local_60;
  Am_Time local_58;
  Am_Object local_50;
  undefined1 local_48 [8];
  Am_Timer_Method method;
  Am_Time local_20;
  Am_Time local_18;
  Am_Time delay;
  Am_Object *interp_local;
  
  delay.data = (Am_Time_Data *)interp;
  pAVar1 = Am_Object::Get(interp,0xe9,0);
  Am_Time::Am_Time(&local_18,pAVar1);
  Am_Time::Am_Time(&local_20,&local_18);
  Am_Object::Am_Object((Am_Object *)&method.Call,interp);
  Am_Register_Timer(&local_20,(Am_Object *)&method.Call,0xe8,false);
  Am_Object::~Am_Object((Am_Object *)&method.Call);
  Am_Time::~Am_Time(&local_20);
  pAVar1 = Am_Object::Get(interp,0xe8,0);
  Am_Timer_Method::Am_Timer_Method((Am_Timer_Method *)local_48,pAVar1);
  Am_Object::Am_Object(&local_50,interp);
  Am_Time::Am_Time(&local_58,0);
  (*(code *)method.from_wrapper)(&local_50,&local_58);
  Am_Time::~Am_Time(&local_58);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Am_Object(&local_60,interp);
  Am_Set_Animated_Slots(&local_60);
  Am_Object::~Am_Object(&local_60);
  Am_Time::~Am_Time(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Animator_Start_Do,
                 (Am_Object interp))
{
  // set up the animation timer
  Am_Time delay = interp.Get(Am_REPEAT_DELAY);
  Am_INTER_TRACE_PRINT(interp, "Animator Start of " << interp
                                                    << " delay = " << delay);
  Am_Register_Timer(delay, interp, Am_ANIMATION_METHOD, false);

  // invoke the animation method for time == 0
  Am_Timer_Method method = interp.Get(Am_ANIMATION_METHOD);
  method.Call(interp, Am_Time(static_cast<unsigned long>(0)));

  Am_Set_Animated_Slots(interp);

  return;
}